

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall pbrt::Disk::ToString_abi_cxx11_(string *__return_storage_ptr__,Disk *this)

{
  float *in_RAX;
  
  StringPrintf<pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ Disk renderFromObject: %s objectFromRender: %s reverseOrientation: %s transformSwapsHandedness: %s height: %f radius: %f innerRadius: %f phiMax: %f ]"
             ,(char *)this->renderFromObject,this->objectFromRender,
             (Transform *)&this->reverseOrientation,&this->transformSwapsHandedness,
             (bool *)&this->height,&this->radius,&this->innerRadius,&this->phiMax,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string Disk::ToString() const {
    return StringPrintf(
        "[ Disk renderFromObject: %s objectFromRender: %s "
        "reverseOrientation: %s "
        "transformSwapsHandedness: %s height: %f radius: %f innerRadius: %f "
        "phiMax: %f ]",
        *renderFromObject, *objectFromRender, reverseOrientation,
        transformSwapsHandedness, height, radius, innerRadius, phiMax);
}